

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTupleExtract(TranslateToFuzzReader *this,Type type)

{
  value_type_conflict2 vVar1;
  char cVar2;
  uint32_t uVar3;
  Type *pTVar4;
  size_t *psVar5;
  size_t sVar6;
  value_type_conflict2 *pvVar7;
  Expression *pEVar8;
  Expression *pEVar9;
  ulong uVar10;
  Iterator __first;
  Iterator __last;
  Type local_78;
  ulong local_70;
  size_t injected;
  size_t i;
  Type type_local;
  Type tupleType;
  Iterator __begin1;
  undefined1 auStack_38 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> extractIndices;
  
  i = type.id;
  cVar2 = wasm::Type::isDefaultable();
  if (cVar2 == '\0') {
    pEVar9 = makeTrivial(this,(Type)i);
  }
  else {
    if (((this->wasm->features).features & 0x200) == 0) {
      __assert_fail("wasm.features.hasMultivalue()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xb01,"Expression *wasm::TranslateToFuzzReader::makeTupleExtract(Type)");
    }
    if ((i < 2) || ((i & 1) != 0 && 6 < i)) {
      __assert_fail("type.isSingle() && type.isConcrete()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xb02,"Expression *wasm::TranslateToFuzzReader::makeTupleExtract(Type)");
    }
    type_local = getTupleType(this);
    extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_38 = (undefined1  [8])0x0;
    extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    injected = 0;
    __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    tupleType.id = (uintptr_t)&type_local;
    pTVar4 = (Type *)Type::size(&type_local);
    if (pTVar4 == (Type *)0x0) goto LAB_00140bd8;
    do {
      do {
        psVar5 = (size_t *)wasm::Type::Iterator::operator*((Iterator *)&tupleType);
        if (*psVar5 == i) {
          if (extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)auStack_38,
                       (iterator)
                       extractIndices.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,&injected);
          }
          else {
            *extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start = injected;
            extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start =
                 extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        injected = injected + 1;
        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      } while (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
               != pTVar4);
LAB_00140bd8:
    } while ((Type *)tupleType.id != &type_local);
    if ((undefined1  [8])
        extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start == auStack_38) {
      sVar6 = Type::size(&type_local);
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           &type_local;
      __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar6;
      __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           &type_local;
      std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)&tupleType,__first,__last,
                 (allocator_type *)&local_70);
      uVar3 = Random::upTo(&this->random,
                           (uint32_t)
                           ((long)__begin1.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                  .parent - tupleType.id >> 3));
      uVar10 = (ulong)uVar3;
      *(size_t *)(tupleType.id + uVar10 * 8) = i;
      local_70 = uVar10;
      wasm::Type::Type(&local_78,(vector *)&tupleType);
      type_local.id = local_78.id;
      if (extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start ==
          extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)auStack_38,
                   (iterator)
                   extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,&local_70);
      }
      else {
        *extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start = uVar10;
        extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      if (tupleType.id != 0) {
        operator_delete((void *)tupleType.id,
                        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .index - tupleType.id);
      }
    }
    pvVar7 = Random::pick<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       (&this->random,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_38);
    vVar1 = *pvVar7;
    pEVar8 = make(this,type_local);
    pEVar9 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
    pEVar9->_id = TupleExtractId;
    (pEVar9->type).id = 0;
    *(Expression **)(pEVar9 + 1) = pEVar8;
    *(int *)&pEVar9[1].type.id = (int)vVar1;
    wasm::TupleExtract::finalize();
    if (auStack_38 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_38,
                      (long)extractIndices.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_38);
    }
  }
  return pEVar9;
}

Assistant:

Expression* TranslateToFuzzReader::makeTupleExtract(Type type) {
  // Tuples can require locals in binary format conversions.
  if (!type.isDefaultable()) {
    return makeTrivial(type);
  }
  assert(wasm.features.hasMultivalue());
  assert(type.isSingle() && type.isConcrete());
  Type tupleType = getTupleType();

  // Find indices from which we can extract `type`
  std::vector<size_t> extractIndices;
  size_t i = 0;
  for (const auto& t : tupleType) {
    if (t == type) {
      extractIndices.push_back(i);
    }
    ++i;
  }

  // If there are none, inject one
  if (extractIndices.size() == 0) {
    std::vector<Type> newElements(tupleType.begin(), tupleType.end());
    size_t injected = upTo(newElements.size());
    newElements[injected] = type;
    tupleType = Type(newElements);
    extractIndices.push_back(injected);
  }

  Index index = pick(extractIndices);
  Expression* child = make(tupleType);
  return builder.makeTupleExtract(child, index);
}